

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opextinst_forward_ref_fixup_pass.cpp
# Opt level: O3

Status __thiscall
spvtools::opt::OpExtInstWithForwardReferenceFixupPass::Process
          (OpExtInstWithForwardReferenceFixupPass *this)

{
  uint uVar1;
  Module *pMVar2;
  IRContext *pIVar3;
  bool bVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  Op OVar7;
  Operand *this_00;
  undefined8 extraout_RAX;
  Op OVar8;
  bool bVar9;
  uint uVar10;
  Status SVar11;
  FeatureManager *pFVar12;
  Instruction *pIVar13;
  long *plVar14;
  Instruction *inst;
  Instruction *this_01;
  bool bVar15;
  uint32_t id;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  seen_ids;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  debug_ids;
  uint32_t local_d4;
  IRContext *local_d0;
  ulong local_c8;
  string local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  long *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68 [3];
  
  pMVar2 = (((this->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  anon_unknown_10::gatherResultIds
            ((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)&local_a0,
             (anon_unknown_10 *)
             *(Instruction **)
              ((long)&(pMVar2->ext_inst_imports_).super_IntrusiveList<spvtools::opt::Instruction> +
              0x10),(IteratorRange<spvtools::opt::InstructionList::iterator> *)
                    ((long)&(pMVar2->ext_inst_imports_).
                            super_IntrusiveList<spvtools::opt::Instruction> + 8));
  pMVar2 = (((this->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  anon_unknown_10::gatherResultIds
            ((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)local_68,
             (anon_unknown_10 *)
             *(Instruction **)
              ((long)&(pMVar2->ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction>
              + 0x10),(IteratorRange<spvtools::opt::InstructionList::iterator> *)
                      ((long)&(pMVar2->ext_inst_debuginfo_).
                              super_IntrusiveList<spvtools::opt::Instruction> + 8));
  if (local_90 != (long *)0x0) {
    plVar14 = local_90;
    do {
      local_d4 = *(uint32_t *)(plVar14 + 1);
      local_c0._M_dataplus._M_p = (pointer)local_68;
      std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)local_68,&local_d4,&local_c0);
      plVar14 = (long *)*plVar14;
    } while (plVar14 != (long *)0x0);
  }
  local_d0 = (this->super_Pass).context_;
  pMVar2 = (local_d0->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  this_01 = *(Instruction **)
             ((long)&(pMVar2->ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction> +
             0x10);
  pIVar13 = (Instruction *)
            ((long)&(pMVar2->ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction> +
            8);
  if (this_01 != pIVar13) {
    local_c8 = 0;
    bVar9 = false;
LAB_002334c8:
    if ((this_01->opcode_ == OpExtInstWithForwardRefsKHR) || (this_01->opcode_ == OpExtInst)) {
      uVar5 = 0;
      if (this_01->has_result_id_ == true) {
        uVar5 = Instruction::GetSingleWordOperand(this_01,(uint)this_01->has_type_id_);
      }
      local_c0._M_dataplus._M_p = (pointer)&local_a0;
      local_d4 = uVar5;
      std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)local_c0._M_dataplus._M_p,&local_d4,&local_c0);
      uVar10 = (this_01->has_result_id_ & 1) + 1;
      if (this_01->has_type_id_ == false) {
        uVar10 = (uint)this_01->has_result_id_;
      }
      uVar10 = (int)((ulong)((long)(this_01->operands_).
                                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this_01->operands_).
                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 -
               uVar10;
      if (uVar10 != 0) {
        uVar5 = 0;
        bVar15 = true;
        do {
          this_00 = Instruction::GetInOperand(this_01,uVar5);
          bVar4 = spvIsIdType(this_00->type);
          if (bVar4) {
            uVar6 = Operand::AsId(this_00);
            plVar14 = *(long **)(local_68[0]._M_allocated_capacity +
                                ((ulong)uVar6 % (ulong)local_68[0]._8_8_) * 8);
            if (plVar14 != (long *)0x0) {
              plVar14 = (long *)*plVar14;
              uVar1 = *(uint *)(plVar14 + 1);
              do {
                if (uVar6 == uVar1) {
                  uVar6 = Operand::AsId(this_00);
                  plVar14 = *(long **)(local_a0._M_allocated_capacity +
                                      ((ulong)uVar6 % (ulong)local_a0._8_8_) * 8);
                  if (plVar14 == (long *)0x0) goto LAB_0023360c;
                  plVar14 = (long *)*plVar14;
                  uVar1 = *(uint *)(plVar14 + 1);
                  goto joined_r0x002335d9;
                }
                plVar14 = (long *)*plVar14;
              } while ((plVar14 != (long *)0x0) &&
                      (uVar1 = *(uint *)(plVar14 + 1),
                      (ulong)uVar1 % (ulong)local_68[0]._8_8_ ==
                      (ulong)uVar6 % (ulong)local_68[0]._8_8_));
            }
          }
LAB_002335f8:
          uVar5 = uVar5 + 1;
          bVar15 = uVar5 < uVar10;
        } while (uVar5 != uVar10);
      }
      OVar8 = this_01->opcode_;
      goto LAB_00233633;
    }
    goto LAB_00233655;
  }
  bVar9 = false;
  local_c8 = 0;
LAB_00233674:
  pIVar3 = local_d0;
  pFVar12 = (local_d0->feature_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
            .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  if (pFVar12 == (FeatureManager *)0x0) {
    IRContext::AnalyzeFeatures(local_d0);
    pFVar12 = (pIVar3->feature_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
              .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  }
  bVar15 = EnumSet<spvtools::Extension>::contains
                     (&pFVar12->extensions_,kSPV_KHR_relaxed_extended_instruction);
  if (bVar15 == bVar9) {
    SVar11 = SuccessWithoutChange;
    if ((local_c8 & 1) == 0) goto LAB_00233719;
  }
  else if (bVar9 == false) {
    IRContext::RemoveExtension(local_d0,kSPV_KHR_relaxed_extended_instruction);
  }
  else {
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,"SPV_KHR_relaxed_extended_instruction","");
    IRContext::AddExtension(local_d0,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
  }
  SVar11 = SuccessWithChange;
LAB_00233719:
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_68);
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_a0);
  return SVar11;
joined_r0x002335d9:
  if (uVar6 == uVar1) goto LAB_002335f8;
  plVar14 = (long *)*plVar14;
  if ((plVar14 == (long *)0x0) ||
     (uVar1 = *(uint *)(plVar14 + 1),
     (ulong)uVar1 % (ulong)local_a0._8_8_ != (ulong)uVar6 % (ulong)local_a0._8_8_))
  goto LAB_0023360c;
  goto joined_r0x002335d9;
LAB_0023360c:
  OVar8 = this_01->opcode_;
  if (bVar15) {
    OVar7 = OpExtInstWithForwardRefsKHR;
    bVar9 = true;
    if (OVar8 == OpExtInstWithForwardRefsKHR) goto LAB_00233655;
  }
  else {
LAB_00233633:
    OVar7 = OpExtInst;
    if (OVar8 == OpExtInst) goto LAB_00233655;
  }
  this_01->opcode_ = OVar7;
  IRContext::AnalyzeUses(local_d0,this_01);
  local_c8 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
LAB_00233655:
  this_01 = (this_01->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  if (this_01 == pIVar13) goto LAB_00233674;
  goto LAB_002334c8;
}

Assistant:

Pass::Status OpExtInstWithForwardReferenceFixupPass::Process() {
  std::unordered_set<uint32_t> seen_ids =
      gatherResultIds(get_module()->ext_inst_imports());
  std::unordered_set<uint32_t> debug_ids =
      gatherResultIds(get_module()->ext_inst_debuginfo());
  for (uint32_t id : seen_ids) debug_ids.insert(id);

  bool moduleChanged = false;
  bool hasAtLeastOneForwardReference = false;
  IRContext* ctx = context();
  for (Instruction& inst : get_module()->ext_inst_debuginfo()) {
    if (inst.opcode() != spv::Op::OpExtInst &&
        inst.opcode() != spv::Op::OpExtInstWithForwardRefsKHR)
      continue;

    seen_ids.insert(inst.result_id());
    bool hasForwardReferences = HasForwardReference(inst, debug_ids, seen_ids);
    hasAtLeastOneForwardReference |= hasForwardReferences;

    if (ReplaceOpcodeIfRequired(inst, hasForwardReferences)) {
      moduleChanged = true;
      ctx->AnalyzeUses(&inst);
    }
  }

  if (hasAtLeastOneForwardReference !=
      ctx->get_feature_mgr()->HasExtension(
          kSPV_KHR_relaxed_extended_instruction)) {
    if (hasAtLeastOneForwardReference)
      ctx->AddExtension("SPV_KHR_relaxed_extended_instruction");
    else
      ctx->RemoveExtension(Extension::kSPV_KHR_relaxed_extended_instruction);
    moduleChanged = true;
  }

  return moduleChanged ? Status::SuccessWithChange
                       : Status::SuccessWithoutChange;
}